

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.h
# Opt level: O0

void replay_record_steal(__cilkrts_worker *w,int32_t victim_id)

{
  undefined4 in_ESI;
  long in_RDI;
  int32_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(*(long *)(in_RDI + 0x30) + 0x498) == 1) {
    replay_record_steal_internal
              ((__cilkrts_worker *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

__CILKRTS_INLINE
void replay_record_steal(__cilkrts_worker *w, int32_t victim_id)
{
#if RECORD_ON_REPLAY
    // If we're recording on replay, write the record if we're recording or
    // replaying
    if (RECORD_REPLAY_NONE == w->g->record_or_replay)
        return;
#else
    // Only write the record if we're recording
    if (RECORD_LOG != w->g->record_or_replay)
        return;
#endif

    replay_record_steal_internal(w, victim_id);
}